

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  reference pvVar6;
  int in_EDX;
  Instruction *in_RSI;
  JitCompilerX86 *in_RDI;
  uint j;
  uint32_t imm;
  int shift;
  uint32_t alignment_size;
  uint32_t branch_end;
  uint32_t branch_begin;
  int32_t jmp_offset;
  int target;
  int reg;
  uint8_t (*in_stack_ffffffffffffffb8) [2];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_20;
  
  bVar1 = in_RSI->dst;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&in_RDI->instructionOffsets,
                      (long)(in_RDI->registerUsage[(int)(uint)bVar1] + 1));
  local_20 = *pvVar6 - (in_RDI->codePos + 0x10);
  if ((BranchesWithin32B & 1) != 0) {
    uVar3 = in_RDI->codePos + 7;
    iVar4 = 0xd;
    if (-0x81 < local_20) {
      iVar4 = 9;
    }
    if (0x1f < (uVar3 ^ uVar3 + iVar4)) {
      iVar4 = 0x20 - (uVar3 & 0x1f);
      local_20 = local_20 - iVar4;
      emit((JitCompilerX86 *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
           (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(size_t)in_RDI);
    }
  }
  emit<2ul>(in_RDI,in_stack_ffffffffffffffb8);
  emitByte(in_RDI,bVar1 - 0x40);
  iVar4 = Instruction::getModCond(in_RSI);
  bVar2 = (char)iVar4 + 8;
  uVar5 = Instruction::getImm32((Instruction *)0x13f0c2);
  emit32(in_RDI,(uVar5 | (uint)(1L << (bVar2 & 0x3f))) &
                ((uint)(1L << (bVar2 - 1 & 0x3f)) ^ 0xffffffff));
  emit<2ul>(in_RDI,in_stack_ffffffffffffffb8);
  emitByte(in_RDI,bVar1 - 0x40);
  emit32(in_RDI,0xff << (bVar2 & 0x1f));
  if (local_20 < -0x80) {
    emit<2ul>(in_RDI,in_stack_ffffffffffffffb8);
    emit32(in_RDI,local_20 - 4);
  }
  else {
    emitByte(in_RDI,'t');
    emitByte(in_RDI,(uint8_t)local_20);
  }
  for (uVar3 = 0; uVar3 < 8; uVar3 = uVar3 + 1) {
    in_RDI->registerUsage[uVar3] = in_EDX;
  }
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;

		int32_t jmp_offset = instructionOffsets[target] - (codePos + 16);

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos + 7);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + ((jmp_offset >= -128) ? 9 : 13));

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				const uint32_t alignment_size = 32 - (branch_begin & 31);
				jmp_offset -= alignment_size;
				emit(JMP_ALIGN_PREFIX[alignment_size], alignment_size);
			}
		}

		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		const int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);

		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);

		if (jmp_offset >= -128) {
			emitByte(JZ_SHORT);
			emitByte(jmp_offset);
		}
		else {
			emit(JZ);
			emit32(jmp_offset - 4);
		}

		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}